

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transmesh.c
# Opt level: O0

int GetKwdIdx(char *KwdStr)

{
  int iVar1;
  char *in_RDI;
  int KwdIdx;
  int local_14;
  
  local_14 = 1;
  while( true ) {
    if (0xf0 < local_14) {
      return 0;
    }
    iVar1 = strcmp(GmfKwdFmt[local_14][0],in_RDI);
    if (iVar1 == 0) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int GetKwdIdx(char *KwdStr)
{
   int KwdIdx;

   for(KwdIdx=1; KwdIdx<=GmfMaxKwd; KwdIdx++)
      if(!strcmp(GmfKwdFmt[ KwdIdx ][0], KwdStr))
         return(KwdIdx);

   return(0);
}